

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fan_calculator.cpp
# Opt level: O0

bool mahjong::is_division_branch_exist
               (intptr_t fixed_cnt,intptr_t step,division_t *work_division,division_result_t *result
               )

{
  anon_class_24_3_6c1b6d77_for__M_pred __pred;
  unsigned_short local_3a [4];
  division_t temp;
  division_result_t *result_local;
  division_t *work_division_local;
  intptr_t step_local;
  intptr_t fixed_cnt_local;
  
  if ((result->count < 1) || (step < 3)) {
    fixed_cnt_local._7_1_ = false;
  }
  else {
    temp.packs._2_8_ = result;
    memcpy(temp.packs + fixed_cnt + -4,work_division->packs + fixed_cnt,step << 1);
    std::sort<unsigned_short*>(temp.packs + fixed_cnt + -4,temp.packs + fixed_cnt + step + -4);
    __pred.fixed_cnt = fixed_cnt;
    __pred.temp = (division_t *)local_3a;
    __pred.step = step;
    fixed_cnt_local._7_1_ =
         std::
         any_of<mahjong::(anonymous_namespace)::division_t_const*,mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::__0>
                   ((division_t *)temp.packs._2_8_,
                    (division_t *)(temp.packs._2_8_ + *(long *)(temp.packs._2_8_ + 200) * 10),__pred
                   );
  }
  return fixed_cnt_local._7_1_;
}

Assistant:

static bool is_division_branch_exist(intptr_t fixed_cnt, intptr_t step, const division_t *work_division, const division_result_t *result) {
    // 没有划分时，以及划分步骤小于3时，不检测，因为至少要有3步递归才会产生不同划分
    if (result->count <= 0 || step < 3) {
        return false;
    }

    // std::includes要求有序
    // 这里不能直接在work_division->packs上排序，否则会破坏递归外层的数据
    division_t temp;
    memcpy(&temp.packs[fixed_cnt], &work_division->packs[fixed_cnt], step * sizeof(pack_t));
    std::sort(&temp.packs[fixed_cnt], &temp.packs[fixed_cnt + step]);

    // 只需要比较面子是否重复分支，雀头不参与比较，所以下标是4
    return std::any_of(&result->divisions[0], &result->divisions[result->count],
        [&temp, fixed_cnt, step](const division_t &od) {
        return std::includes(&od.packs[fixed_cnt], &od.packs[4], &temp.packs[fixed_cnt], &temp.packs[fixed_cnt + step]);
    });
}